

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O1

void __thiscall phoenix_evsa_t::evsa_guid_t::~evsa_guid_t(evsa_guid_t *this)

{
  pointer pcVar1;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__evsa_guid_t_001851c0;
  pcVar1 = (this->m_guid)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_guid).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

phoenix_evsa_t::evsa_guid_t::~evsa_guid_t() {
    _clean_up();
}